

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool P_BounceActor(AActor *mo,AActor *BlockingMobj,bool ontop)

{
  byte *pbVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  FState *pFVar8;
  undefined4 extraout_var;
  int iVar9;
  bool bVar10;
  FName names [3];
  undefined1 local_58 [52];
  FName local_24;
  
  if (((BlockingMobj == (AActor *)0x0) || (-1 < (int)(BlockingMobj->flags2).Value)) ||
     (bVar10 = true, ((BlockingMobj->flags7).Value & 0x800) == 0)) {
    if ((mo == (AActor *)0x0 || BlockingMobj == (AActor *)0x0) ||
       (((uVar5 = (mo->BounceFlags).Value, (uVar5 & 0x10) == 0 &&
         (((((mo->flags).Value & 0x10000) == 0 ||
           ((((((mo->flags2).Value & 0x100) != 0 && (((BlockingMobj->flags5).Value & 0x80000) == 0))
             && ((((mo->flags6).Value & 1) == 0 || (((BlockingMobj->flags2).Value & 0x8000) == 0))))
            || (-1 < (int)(BlockingMobj->flags2).Value)))) &&
          ((BlockingMobj->player != (player_t *)0x0 ||
           (((BlockingMobj->flags3).Value & 0x2000) != 0)))))) ||
        ((0 < mo->bouncecount && (iVar9 = mo->bouncecount + -1, mo->bouncecount = iVar9, iVar9 == 0)
         ))))) {
      bVar10 = false;
    }
    else {
      uVar6 = (mo->flags7).Value;
      if ((uVar6 >> 0xe & 1) != 0) {
        (mo->target).field_0.p = BlockingMobj;
      }
      if ((short)uVar6 < 0) {
        (mo->master).field_0.p = BlockingMobj;
      }
      if ((uVar6 >> 0x10 & 1) != 0) {
        (mo->tracer).field_0.p = BlockingMobj;
      }
      if (ontop) {
        dVar3 = (mo->Vel).Z;
        dVar3 = -2.0 / dVar3 + dVar3;
        if (((uVar5 & 0x1040) == 0) || ((mo->Vel).Z = dVar3, (uVar5 >> 0xc & 1) != 0)) {
          (mo->Vel).Z = dVar3 * mo->bouncefactor;
          AActor::PlayBounceSound(mo,true);
          uVar5 = (mo->BounceFlags).Value;
          if ((uVar5 >> 0xc & 1) == 0) {
            bVar10 = true;
            if ((((uVar5 & 0x2020) != 0) && (((mo->flags).Value & 0x200) == 0)) &&
               (pdVar2 = &(mo->Vel).Z, *pdVar2 <= 3.0 && *pdVar2 != 3.0)) {
              (mo->BounceFlags).Value = uVar5 & 0xef90;
            }
          }
          else {
            local_58._16_8_ = (ulong)(mo->Vel).Z & 0x7fffffffffffffff;
            local_58._24_8_ = (DObject *)0x0;
            local_58._40_8_ = (undefined8)mo->Mass;
            dVar3 = AActor::GetGravity(mo);
            bVar10 = true;
            if ((double)local_58._16_8_ < dVar3 * (double)local_58._40_8_ * 0.015625) {
              (mo->Vel).Z = 0.0;
            }
          }
        }
        else {
          pbVar1 = (byte *)((long)&(mo->flags).Value + 2);
          *pbVar1 = *pbVar1 | 0x20;
          local_24.Index = 0x8c;
          pFVar8 = AActor::FindState(mo,&local_24);
          bVar10 = false;
          AActor::SetState(mo,pFVar8,false);
          pbVar1 = (byte *)((long)&(mo->flags).Value + 2);
          *pbVar1 = *pbVar1 & 0xdf;
        }
      }
      else {
        AActor::AngleTo((AActor *)local_58,BlockingMobj,SUB81(mo,0));
        uVar6 = FRandom::GenRand32(&pr_bounce);
        local_58._16_8_ = (double)(int)((uVar6 & 0xf) - 8) + (double)local_58._0_8_;
        dVar3 = (mo->Vel).X;
        dVar4 = (mo->Vel).Y;
        dVar4 = c_sqrt(dVar4 * dVar4 + dVar3 * dVar3);
        dVar3 = mo->wallbouncefactor;
        (mo->Angles).Yaw.Degrees = (double)local_58._16_8_;
        AActor::VelFromAngle(mo,dVar4 * dVar3);
        AActor::PlayBounceSound(mo,true);
        bVar10 = true;
        if (((mo->BounceFlags).Value & 0x4000) != 0) {
          local_58._0_8_ = (_func_int **)0x400000097;
          local_58._8_4_ = 0x9b;
          uVar6 = (BlockingMobj->flags).Value;
          iVar9 = 3 - (uint)((uVar6 >> 0x13 & 1) != 0);
          if ((uVar6 & 4) == 0) {
            iVar9 = 2;
          }
          if ((mo->super_DThinker).super_DObject.Class == (PClass *)0x0) {
            iVar7 = (**(mo->super_DThinker).super_DObject._vptr_DObject)(mo);
            (mo->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar7);
          }
          pFVar8 = PClassActor::FindState
                             ((PClassActor *)(mo->super_DThinker).super_DObject.Class,iVar9,
                              (FName *)local_58,false);
          if (pFVar8 != (FState *)0x0) {
            AActor::SetState(mo,pFVar8,false);
          }
        }
      }
    }
  }
  return bVar10;
}

Assistant:

bool P_BounceActor(AActor *mo, AActor *BlockingMobj, bool ontop)
{
	//Don't go through all of this if the actor is reflective and wants things to pass through them.
	if (BlockingMobj && ((BlockingMobj->flags2 & MF2_REFLECTIVE) && (BlockingMobj->flags7 & MF7_THRUREFLECT))) return true;
	if (mo && BlockingMobj && ((mo->BounceFlags & BOUNCE_AllActors)
		|| ((mo->flags & MF_MISSILE) && (!(mo->flags2 & MF2_RIP) 
		|| (BlockingMobj->flags5 & MF5_DONTRIP) 
		|| ((mo->flags6 & MF6_NOBOSSRIP) && (BlockingMobj->flags2 & MF2_BOSS))) && (BlockingMobj->flags2 & MF2_REFLECTIVE))
		|| ((BlockingMobj->player == NULL) && (!(BlockingMobj->flags3 & MF3_ISMONSTER)))))
	{
		if (mo->bouncecount > 0 && --mo->bouncecount == 0) return false;

		if (mo->flags7 & MF7_HITTARGET)	mo->target = BlockingMobj;
		if (mo->flags7 & MF7_HITMASTER)	mo->master = BlockingMobj;
		if (mo->flags7 & MF7_HITTRACER)	mo->tracer = BlockingMobj;

		if (!ontop)
		{
			DAngle angle = BlockingMobj->AngleTo(mo) + ((pr_bounce() % 16) - 8);
			double speed = mo->VelXYToSpeed() * mo->wallbouncefactor; // [GZ] was 0.75, using wallbouncefactor seems more consistent
			mo->Angles.Yaw = angle;
			mo->VelFromAngle(speed);
			mo->PlayBounceSound(true);
			if (mo->BounceFlags & BOUNCE_UseBounceState)
			{
				FName names[] = { NAME_Bounce, NAME_Actor, NAME_Creature };
				FState *bouncestate;
				int count = 2;

				if ((BlockingMobj->flags & MF_SHOOTABLE) && !(BlockingMobj->flags & MF_NOBLOOD))
				{
					count = 3;
				}
				bouncestate = mo->FindState(count, names);
				if (bouncestate != NULL)
				{
					mo->SetState(bouncestate);
				}
			}
		}
		else
		{
			double dot = mo->Vel.Z;

			if (mo->BounceFlags & (BOUNCE_HereticType | BOUNCE_MBF))
			{
				mo->Vel.Z -= 2. / dot;
				if (!(mo->BounceFlags & BOUNCE_MBF)) // Heretic projectiles die, MBF projectiles don't.
				{
					mo->flags |= MF_INBOUNCE;
					mo->SetState(mo->FindState(NAME_Death));
					mo->flags &= ~MF_INBOUNCE;
					return false;
				}
				else
				{
					mo->Vel.Z *= mo->bouncefactor;
				}
			}
			else // Don't run through this for MBF-style bounces
			{
				// The reflected velocity keeps only about 70% of its original speed
				mo->Vel.Z = (mo->Vel.Z - 2. / dot) * mo->bouncefactor;
			}

			mo->PlayBounceSound(true);
			if (mo->BounceFlags & BOUNCE_MBF) // Bring it to rest below a certain speed
			{
				if (fabs(mo->Vel.Z) < mo->Mass * mo->GetGravity() / 64)
					mo->Vel.Z = 0;
			}
			else if (mo->BounceFlags & (BOUNCE_AutoOff | BOUNCE_AutoOffFloorOnly))
			{
				if (!(mo->flags & MF_NOGRAVITY) && (mo->Vel.Z < 3.))
					mo->BounceFlags &= ~BOUNCE_TypeMask;
			}
		}
		return true;
	}
	return false;
}